

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

int * Gia_AigerReadMapping(uchar **ppPos,int nSize)

{
  uchar *pPos;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  int iVar9;
  
  pPos = *ppPos;
  iVar1 = Gia_AigerReadInt(pPos);
  puVar7 = pPos + 4;
  *ppPos = puVar7;
  iVar5 = (nSize + (int)(pPos + iVar1)) - (int)puVar7;
  piVar4 = (int *)calloc((long)iVar5,4);
  iVar9 = 0;
  while (puVar7 < pPos + iVar1) {
    uVar2 = Gia_AigerReadUnsigned(ppPos);
    piVar4[nSize] = uVar2;
    for (lVar8 = 0; (int)lVar8 <= (int)uVar2; lVar8 = lVar8 + 1) {
      uVar3 = Gia_AigerReadUnsigned(ppPos);
      iVar6 = -((int)uVar3 >> 1);
      if ((uVar3 & 1) != 0) {
        iVar6 = (int)uVar3 >> 1;
      }
      iVar9 = iVar9 + iVar6;
      piVar4[(long)nSize + lVar8 + 1] = iVar9;
    }
    piVar4[iVar9] = nSize;
    nSize = nSize + (int)lVar8 + 1;
    puVar7 = *ppPos;
  }
  if (nSize <= iVar5) {
    return piVar4;
  }
  __assert_fail("iOffset <= nAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaAigerExt.c"
                ,0xa1,"int *Gia_AigerReadMapping(unsigned char **, int)");
}

Assistant:

int * Gia_AigerReadMapping( unsigned char ** ppPos, int nSize )
{
    int * pMapping;
    unsigned char * pStop;
    int k, j, nFanins, nAlloc, iNode = 0, iOffset = nSize;
    pStop = *ppPos;
    pStop += Gia_AigerReadInt( *ppPos ); *ppPos += 4;
    nAlloc = nSize + pStop - *ppPos;
    pMapping = ABC_CALLOC( int, nAlloc );
    while ( *ppPos < pStop )
    {
        k = iOffset;
        pMapping[k++] = nFanins = Gia_AigerReadUnsigned( ppPos );
        for ( j = 0; j <= nFanins; j++ )
            pMapping[k++] = iNode = Gia_AigerReadDiffValue( ppPos, iNode );
        pMapping[iNode] = iOffset;
        iOffset = k;
    }
    assert( iOffset <= nAlloc );
    return pMapping;
}